

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O2

ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>
testing::ValuesIn<(anonymous_namespace)::nonUniformTileConfigParam,6ul>
          (anon_struct_524_5_7b11162c_for__M_head_impl (*array) [6])

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar4;
  ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam> PVar5;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = &PTR__ValuesInIteratorRangeGenerator_00f04c28;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  pvVar2 = operator_new(0xc48);
  puVar1[1] = pvVar2;
  puVar1[3] = (long)pvVar2 + 0xc48;
  for (lVar4 = 0; lVar4 != 0xc48; lVar4 = lVar4 + 0x20c) {
    memcpy((void *)((long)pvVar2 + lVar4),
           ::(anonymous_namespace)::nonUniformTileConfigParams + lVar4,0x20c);
  }
  puVar1[2] = (void *)((long)pvVar2 + lVar4);
  *(undefined8 **)*array = puVar1;
  ((anon_struct_524_5_7b11162c_for__M_head_impl *)((long)array + 0))->tile_widths[0] = 0;
  ((anon_struct_524_5_7b11162c_for__M_head_impl *)((long)array + 0))->tile_widths[1] = 0;
  puVar3 = (undefined8 *)operator_new(0x18);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_base_00f04cf0;
  puVar3[2] = puVar1;
  *(undefined8 **)(*array)[0].tile_widths = puVar3;
  PVar5.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar5.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)array;
  return (ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>)
         PVar5.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}